

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_job_queue_get_heap_layout
                    (ma_job_queue_config *pConfig,ma_job_queue_heap_layout *pHeapLayout)

{
  ma_result mVar1;
  size_t sVar2;
  size_t allocatorHeapSizeInBytes;
  ma_slot_allocator_config allocatorConfig;
  
  if (pHeapLayout != (ma_job_queue_heap_layout *)0x0) {
    pHeapLayout->jobsOffset = 0;
    pHeapLayout->sizeInBytes = 0;
    pHeapLayout->allocatorOffset = 0;
    mVar1 = MA_INVALID_ARGS;
    if ((pConfig != (ma_job_queue_config *)0x0) &&
       (allocatorConfig.capacity = pConfig->capacity, allocatorConfig.capacity != 0)) {
      mVar1 = ma_slot_allocator_get_heap_size(&allocatorConfig,&allocatorHeapSizeInBytes);
      if (mVar1 == MA_SUCCESS) {
        pHeapLayout->allocatorOffset = pHeapLayout->sizeInBytes;
        sVar2 = pHeapLayout->sizeInBytes + allocatorHeapSizeInBytes;
        pHeapLayout->jobsOffset = sVar2;
        pHeapLayout->sizeInBytes = (ulong)pConfig->capacity * 0x68 + sVar2;
        mVar1 = MA_SUCCESS;
      }
    }
    return mVar1;
  }
  __assert_fail("pHeapLayout != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x163b,
                "ma_result ma_job_queue_get_heap_layout(const ma_job_queue_config *, ma_job_queue_heap_layout *)"
               );
}

Assistant:

static ma_result ma_job_queue_get_heap_layout(const ma_job_queue_config* pConfig, ma_job_queue_heap_layout* pHeapLayout)
{
    ma_result result;

    MA_ASSERT(pHeapLayout != NULL);

    MA_ZERO_OBJECT(pHeapLayout);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->capacity == 0) {
        return MA_INVALID_ARGS;
    }

    pHeapLayout->sizeInBytes = 0;

    /* Allocator. */
    {
        ma_slot_allocator_config allocatorConfig;
        size_t allocatorHeapSizeInBytes;

        allocatorConfig = ma_slot_allocator_config_init(pConfig->capacity);
        result = ma_slot_allocator_get_heap_size(&allocatorConfig, &allocatorHeapSizeInBytes);
        if (result != MA_SUCCESS) {
            return result;
        }

        pHeapLayout->allocatorOffset = pHeapLayout->sizeInBytes;
        pHeapLayout->sizeInBytes    += allocatorHeapSizeInBytes;
    }

    /* Jobs. */
    pHeapLayout->jobsOffset   = pHeapLayout->sizeInBytes;
    pHeapLayout->sizeInBytes += ma_align_64(pConfig->capacity * sizeof(ma_job));

    return MA_SUCCESS;
}